

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_shape_fitting.hpp
# Opt level: O1

vector<float,_std::allocator<float>_> *
eos::fitting::fit_shape_to_landmarks_linear
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,PcaModel *shape_model,
          Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *landmarks,vector<int,_std::allocator<int>_> *vertex_ids,VectorXf *base_face,float lambda,
          optional<int> num_coefficients_to_fit,optional<float> detector_standard_deviation,
          optional<float> model_standard_deviation)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float *pfVar4;
  pointer piVar5;
  long lVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  LhsNested pSVar10;
  vector<float,std::allocator<float>> *this;
  Index size;
  undefined8 *puVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  float *pfVar15;
  undefined8 uVar16;
  Triplet<float,_int> *pTVar17;
  ulong uVar18;
  long lVar19;
  Triplet<float,_int> *pTVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> P_coefficients;
  MatrixXf A;
  MatrixXf V_hat_h;
  VectorXf v_bar;
  VectorXf y;
  VectorXf Omega;
  VectorXf c_s;
  MatrixXf AtOmegaAReg;
  SparseMatrix<float,_0,_int> P;
  MatrixXf rhs;
  DenseStorage<float,__1,__1,__1,_0> local_268;
  undefined1 local_248 [8];
  LhsNested pSStack_240;
  Triplet<float,_int> *local_238;
  undefined1 local_228 [48];
  DenseStorage<float,__1,__1,__1,_0> local_1f8;
  LhsNested local_1e0;
  LhsNested local_1d8;
  vector<int,_std::allocator<int>_> *local_1d0;
  void *local_1c8;
  Triplet<float,_int> *local_1c0;
  void *local_1b8;
  assign_op<float,_float> *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [8];
  undefined8 local_190;
  variable_if_dynamic<long,__1> local_188;
  DenseStorage<float,__1,__1,__1,_0> *local_180;
  variable_if_dynamic<long,__1> local_178;
  variable_if_dynamic<long,__1> local_170;
  Triplet<float,_int> *local_168;
  Triplet<float,_int> *local_160;
  Triplet<float,_int> *local_158;
  void *local_150;
  void *local_140;
  void *local_130;
  float *local_100;
  long local_f8;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *local_f0;
  vector<float,std::allocator<float>> *local_e8;
  Triplet<float,_int> *local_e0;
  ulong local_d8;
  float *local_d0;
  ulong local_c8;
  long local_c0;
  void *local_b8 [3];
  SparseMatrix<float,_0,_int> local_a0;
  void *local_58 [3];
  SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *local_40;
  MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *local_38;
  
  lVar13 = (long)(landmarks->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(landmarks->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  local_228._44_4_ = lambda;
  local_1d0 = vertex_ids;
  local_d0 = (float *)affine_camera_matrix;
  if (lVar13 != (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) {
    __assert_fail("landmarks.size() == vertex_ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/linear_shape_fitting.hpp"
                  ,0x44,
                  "std::vector<float> eos::fitting::fit_shape_to_landmarks_linear(const morphablemodel::PcaModel &, Eigen::Matrix<float, 3, 4>, const std::vector<Eigen::Vector2f> &, const std::vector<int> &, Eigen::VectorXf, float, cpp17::optional<int>, cpp17::optional<float>, cpp17::optional<float>)"
                 );
  }
  if (((ulong)num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
    num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> =
         (_Optional_base<int,_true,_true>)
         (shape_model->rescaled_pca_basis).
         super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  }
  local_228._24_8_ = base_face;
  local_f0 = landmarks;
  if ((base_face->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      0) {
    pfVar15 = (shape_model->mean).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar14 = (shape_model->mean).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (uVar14 != 0) {
      if ((long)uVar14 < 0) {
        pcVar12 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
        ;
        goto LAB_0010d58f;
      }
      Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                ((DenseStorage<float,__1,__1,_1,_0> *)base_face,uVar14,uVar14,1);
    }
    uVar18 = (((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_228._24_8_)->
             m_storage).m_rows;
    if (uVar18 != uVar14) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::Matrix<float, -1, 1>, T1 = float, T2 = float]"
                   );
    }
    pfVar4 = (((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_228._24_8_)->
             m_storage).m_data;
    uVar14 = uVar18 + 3;
    if (-1 < (long)uVar18) {
      uVar14 = uVar18;
    }
    uVar14 = uVar14 & 0xfffffffffffffffc;
    if (3 < (long)uVar18) {
      lVar19 = 0;
      do {
        pfVar1 = pfVar15 + lVar19;
        uVar16 = *(undefined8 *)(pfVar1 + 2);
        pfVar2 = pfVar4 + lVar19;
        *(undefined8 *)pfVar2 = *(undefined8 *)pfVar1;
        *(undefined8 *)(pfVar2 + 2) = uVar16;
        lVar19 = lVar19 + 4;
      } while (lVar19 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar18) {
      do {
        pfVar4[uVar14] = pfVar15[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar18 != uVar14);
    }
  }
  uVar8 = (uint)lVar13;
  local_1d8 = (LhsNested)(long)(int)(uVar8 * 4);
  pTVar17 = (Triplet<float,_int> *)
            (long)num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_payload;
  local_188.m_value = local_188.m_value & 0xffffffff00000000;
  local_198 = (undefined1  [8])local_1d8;
  local_190 = (long)pTVar17;
  local_e8 = (vector<float,std::allocator<float>> *)__return_storage_ptr__;
  if ((int)(num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_payload | uVar8 * 4) < 0) {
    pcVar12 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
    ;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_1f8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)local_198);
    if (0 < (int)uVar8) {
      lVar19 = 0;
      pTVar20 = (Triplet<float,_int> *)0x0;
      do {
        morphablemodel::PcaModel::get_rescaled_pca_basis_at_point
                  ((MatrixXf *)&local_268,shape_model,
                   *(int *)((long)&(((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
                                    &pTVar20->m_row)->m_storage).m_data +
                           (long)(local_1d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start));
        if ((long)(local_268.m_rows | (ulong)pTVar17) < 0 &&
            (LhsNested)local_268.m_data != (LhsNested)0x0) {
          pcVar12 = 
          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>>, Level = 0]"
          ;
LAB_0010d556:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb2,pcVar12);
        }
        if (((long)(local_268.m_rows | (ulong)pTVar17) < 0) || (local_268.m_cols < (long)pTVar17)) {
          pcVar12 = 
          "Eigen::Block<const Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
          ;
LAB_0010d501:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                        ,0x93,pcVar12);
        }
        local_198 = (undefined1  [8])((long)local_1f8.m_data + lVar19);
        local_190 = 3;
        local_188.m_value = local_1f8.m_cols;
        if (local_1f8.m_cols < 0 && local_1f8.m_data != (float *)0x0) {
          pcVar12 = 
          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>>, Level = 0]"
          ;
          goto LAB_0010d556;
        }
        local_180 = &local_1f8;
        local_170.m_value = 0;
        local_168 = (Triplet<float,_int> *)local_1f8.m_rows;
        local_178.m_value = (long)pTVar20;
        if ((local_1f8.m_cols < 0) || (local_1f8.m_rows + 0xfffffffffffffff4U + 9U < (long)pTVar20))
        {
          pcVar12 = 
          "Eigen::Block<Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
          ;
          goto LAB_0010d501;
        }
        local_248 = (undefined1  [8])local_268.m_data;
        local_238 = (Triplet<float,_int> *)local_268.m_rows;
        if (((Triplet<float,_int> *)local_268.m_rows != (Triplet<float,_int> *)0x3) ||
           ((Triplet<float,_int> *)local_1f8.m_cols != pTVar17)) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseBase.h"
                        ,0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>>]"
                       );
        }
        local_228._16_8_ = local_1f8.m_rows;
        local_a0._0_8_ = local_228;
        local_a0.m_outerSize = (Index)local_248;
        local_a0.m_innerSize = (Index)local_b8;
        local_a0.m_outerIndex = (StorageIndex *)local_198;
        local_228._0_8_ = local_198;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)&local_a0);
        pTVar20 = (Triplet<float,_int> *)&pTVar20->m_col;
        free(local_268.m_data);
        lVar19 = lVar19 + 0x10;
      } while ((Triplet<float,_int> *)((ulong)(uVar8 & 0x7fffffff) << 2) != pTVar20);
    }
    local_1e0 = (LhsNested)((lVar13 << 0x20) * 3 >> 0x20);
    local_a0._0_8_ = local_a0._0_8_ & 0xffffffffffffff00;
    local_a0.m_outerSize = 0;
    local_a0.m_innerSize = 0;
    local_a0.m_outerIndex = (StorageIndex *)0x0;
    local_a0.m_innerNonZeros = (StorageIndex *)0x0;
    local_a0.m_data.m_values = (Scalar *)0x0;
    local_a0.m_data.m_indices = (StorageIndex *)0x0;
    local_a0.m_data.m_size = 0;
    local_a0.m_data.m_allocatedSize = 0;
    local_e0 = pTVar17;
    Eigen::SparseMatrix<float,_0,_int>::resize(&local_a0,(Index)local_1e0,(Index)local_1d8);
    local_248 = (undefined1  [8])0x0;
    pSStack_240 = (LhsNested)0x0;
    local_238 = (Triplet<float,_int> *)0x0;
    if (0 < (int)uVar8) {
      local_d8 = (ulong)(uVar8 & 0x7fffffff);
      local_228._32_8_ = 0;
      uVar14 = 0;
      do {
        local_c0 = uVar14 * 3;
        bVar21 = true;
        uVar18 = 0;
        pfVar15 = local_d0;
        local_c8 = uVar14;
        do {
          iVar9 = (int)local_c0;
          lVar13 = -0x30;
          uVar14 = local_228._32_8_ & 0xffffffff;
          do {
            if (!bVar21) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, 3, 4>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<float, 3, 4>, Level = 1]"
                           );
            }
            local_198._4_4_ = (int)uVar14;
            local_198._0_4_ = iVar9 + (int)uVar18;
            fVar3 = *(float *)((long)pfVar15 + lVar13 + 0x30);
            local_190._0_4_ = fVar3;
            if (pSStack_240 == (LhsNested)local_238) {
              std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>::
              _M_realloc_insert<Eigen::Triplet<float,int>>
                        ((vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>
                          *)local_248,(iterator)pSStack_240,(Triplet<float,_int> *)local_198);
            }
            else {
              *(float *)&pSStack_240->m_outerSize = fVar3;
              pSStack_240->super_SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_> =
                   local_198;
              pSStack_240 = (LhsNested)((long)pSStack_240 + 0xc);
            }
            uVar14 = (ulong)((int)uVar14 + 1);
            lVar13 = lVar13 + 0xc;
          } while (lVar13 != 0);
          bVar21 = uVar18 < 2;
          uVar18 = uVar18 + 1;
          pfVar15 = pfVar15 + 1;
        } while (uVar18 != 3);
        uVar14 = local_c8 + 1;
        local_228._32_8_ = ZEXT48((int)local_228._32_8_ + 4);
      } while (uVar14 != local_d8);
    }
    local_198 = local_248;
    local_228._0_8_ = pSStack_240;
    Eigen::internal::
    set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<float,int>*,std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>>,Eigen::SparseMatrix<float,0,int>,Eigen::internal::scalar_sum_op<float,float>>
              (local_198,local_228,&local_a0,&local_268);
    pTVar17 = local_e0;
    pSVar10 = local_1e0;
    uVar16 = local_228._24_8_;
    if (((ulong)detector_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> & 0x100000000) == 0) {
      dVar23 = 1.7320507764816284;
    }
    else {
      dVar23 = (double)detector_standard_deviation.super__Optional_base<float,_true,_true>.
                       _M_payload.super__Optional_payload_base<float>._M_payload._M_value;
    }
    dVar24 = 0.0;
    if (((ulong)model_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> & 0x100000000) != 0) {
      dVar24 = (double)model_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value;
    }
    local_198 = (undefined1  [8])local_1e0;
    local_190._4_4_ = 1.0 / (float)(dVar23 * dVar23 + dVar24 * dVar24);
    if (-1 < (long)local_1e0) {
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_1a8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_198);
      local_198 = (undefined1  [8])pSVar10;
      local_190._4_4_ = 1.0;
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_1b8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_198);
      if (0 < (int)uVar8) {
        pfVar15 = (float *)((long)&(((local_f0->
                                     super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).
                                   m_storage.m_data + 4);
        lVar13 = 0;
        do {
          if (((long)local_1b0 <= lVar13) ||
             (*(float *)((long)local_1b8 + lVar13 * 4) =
                   ((plain_array<float,_2,_0,_0> *)(pfVar15 + -1))->array[0],
             (long)local_1b0 <= lVar13 + 1)) goto LAB_0010d4b6;
          *(float *)((long)local_1b8 + lVar13 * 4 + 4) = *pfVar15;
          lVar13 = lVar13 + 3;
          pfVar15 = pfVar15 + 2;
        } while ((ulong)(uVar8 & 0x7fffffff) * 3 != lVar13);
      }
      local_198 = (undefined1  [8])local_1d8;
      local_190._4_4_ = 1.0;
      if (-1 < (int)uVar8) {
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_1c8,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                    *)local_198);
        if (uVar8 != 0) {
          piVar5 = (local_1d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar13 = 0;
          do {
            lVar19 = (long)*(int *)((long)piVar5 + lVar13);
            if (lVar19 < 0) {
LAB_0010d4b6:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<float, -1, 1>, Level = 1]"
                           );
            }
            lVar6 = (((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)uVar16)->m_storage)
                    .m_rows;
            if ((lVar6 <= lVar19 * 3) || ((long)local_1c0 <= lVar13)) goto LAB_0010d4b6;
            pfVar15 = (((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)uVar16)->
                      m_storage).m_data;
            *(float *)((long)local_1c8 + lVar13 * 4) = pfVar15[lVar19 * 3];
            iVar9 = (int)(lVar19 * 3);
            uVar14 = (ulong)(iVar9 + 1);
            if ((lVar6 <= (long)uVar14) || ((long)local_1c0 <= lVar13 + 1)) goto LAB_0010d4b6;
            *(float *)((long)local_1c8 + (lVar13 + 1) * 4) = pfVar15[uVar14];
            uVar14 = (ulong)(iVar9 + 2);
            if ((lVar6 <= (long)uVar14) || ((long)local_1c0 <= lVar13 + 2)) goto LAB_0010d4b6;
            *(float *)((long)local_1c8 + (lVar13 + 2) * 4) = pfVar15[uVar14];
            lVar13 = lVar13 + 4;
          } while ((ulong)(uVar8 & 0x7fffffff) << 2 != lVar13);
        }
        if (local_a0.m_outerSize != local_1f8.m_rows) {
          pcVar12 = 
          "Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<float>, _Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
          ;
          goto LAB_0010d6cc;
        }
        local_190 = (long)&local_1f8;
        local_228._0_8_ = (LhsNested)0x0;
        local_228._8_8_ = (Triplet<float,_int> *)0x0;
        local_228._16_8_ = (Triplet<float,_int> *)0x0;
        bVar21 = (assign_op<float,_float> *)local_a0.m_innerSize == (assign_op<float,_float> *)0x0;
        bVar22 = (Triplet<float,_int> *)local_1f8.m_cols == (Triplet<float,_int> *)0x0;
        local_198 = (undefined1  [8])&local_a0;
        if ((!bVar22 && !bVar21) &&
           (auVar7 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
           uVar16 = SUB168(auVar7 % SEXT816(local_1f8.m_cols),0),
           SUB168(auVar7 / SEXT816(local_1f8.m_cols),0) < local_a0.m_innerSize)) {
LAB_0010d5ec:
          puVar11 = (undefined8 *)__cxa_allocate_exception(8,bVar22 || bVar21,uVar16);
          *puVar11 = boost::program_options::detail::cmdline::cmdline;
          __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        if (-1 < (local_1f8.m_cols | local_a0.m_innerSize)) {
          if ((!bVar22 && !bVar21) &&
             (auVar7 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
             uVar16 = SUB168(auVar7 % SEXT816(local_1f8.m_cols),0),
             SUB168(auVar7 / SEXT816(local_1f8.m_cols),0) < local_a0.m_innerSize))
          goto LAB_0010d5ec;
          Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<float,__1,__1,__1,_0> *)local_228,
                     local_1f8.m_cols * local_a0.m_innerSize,local_a0.m_innerSize,local_1f8.m_cols);
          Eigen::internal::
          Assignment<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<float,__1,__1,_0,__1,__1> *)local_228,(SrcXprType *)local_198,
                (assign_op<float,_float> *)&local_268);
          this = local_e8;
          if ((Triplet<float,_int> *)local_a0.m_outerSize != local_1c0) {
            pcVar12 = 
            "Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<float>, _Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
            ;
LAB_0010d6cc:
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                          ,0x62,pcVar12);
          }
          local_190 = (long)&local_1c8;
          local_188.m_value = (long)&local_1b8;
          if ((assign_op<float,_float> *)local_a0.m_innerSize != local_1b0) {
            pcVar12 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>, const Eigen::Matrix<float, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Matrix<float, -1, 1>]"
            ;
            local_198 = (undefined1  [8])&local_a0;
LAB_0010d696:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                          ,0x74,pcVar12);
          }
          local_268.m_data = (float *)0x0;
          local_268.m_rows = 0;
          local_268.m_cols = 0;
          if (-1 < (long)local_1b0) {
            local_198 = (undefined1  [8])&local_a0;
            Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize
                      (&local_268,(Index)local_1b0,(Index)local_1b0,1);
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const,Eigen::Matrix<float,_1,1,0,_1,1>const>,Eigen::internal::assign_op<float,float>>
                      ((Matrix<float,__1,__1,_0,__1,__1> *)&local_268,
                       (CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                        *)local_198,(assign_op<float,_float> *)local_b8);
            if (local_228._8_8_ == local_1a8._8_8_) {
              if ((long)pTVar17 < 0) {
                pcVar12 = 
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                ;
                goto LAB_0010d677;
              }
              local_178.m_value = (long)pTVar17;
              local_170.m_value = (long)pTVar17;
              local_168 = (Triplet<float,_int> *)CONCAT44(local_168._4_4_,local_228._44_4_);
              local_160 = pTVar17;
              local_158 = pTVar17;
              local_198 = (undefined1  [8])local_228;
              local_190 = (long)local_1a8;
              local_188.m_value = (long)local_228;
              if ((Triplet<float,_int> *)local_228._16_8_ != pTVar17) {
                pcVar12 = 
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Product<Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Product<Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1>>>]"
                ;
                goto LAB_0010d696;
              }
              Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
              PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>const>const>>
                        ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_b8,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>_>
                          *)local_198);
              if (local_228._8_8_ == local_1a8._8_8_) {
                local_188.m_value = (long)local_1a8;
                local_180 = &local_268;
                if (local_1a8._8_8_ == local_268.m_rows) {
                  local_198 = (undefined1  [8])local_228;
                  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
                  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
                            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_58,
                             (DenseBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                              *)local_198);
                  Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
                  ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>
                            ((ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_198,
                             (EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_b8);
                  Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>>
                  ::
                  _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                            ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                              *)local_198,
                             (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_58);
                  local_40 = (SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                              *)local_198;
                  local_38 = (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_58;
                  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
                  PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_100,
                             (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                              *)&local_40);
                  free(local_130);
                  free(local_140);
                  free(local_150);
                  free(local_160);
                  free((void *)local_170.m_value);
                  free(local_180);
                  free((void *)local_198);
                  std::vector<float,std::allocator<float>>::vector<float_const*,void>
                            (this,local_100,local_100 + local_f8,(allocator_type *)local_198);
                  free(local_100);
                  free(local_58[0]);
                  free(local_b8[0]);
                  free(local_268.m_data);
                  free((void *)local_228._0_8_);
                  free(local_1c8);
                  free(local_1b8);
                  free((void *)local_1a8._0_8_);
                  if (local_248 != (undefined1  [8])0x0) {
                    operator_delete((void *)local_248,(long)local_238 - (long)local_248);
                  }
                  free(local_a0.m_outerIndex);
                  free(local_a0.m_innerNonZeros);
                  Eigen::internal::CompressedStorage<float,_int>::~CompressedStorage
                            (&local_a0.m_data);
                  free(local_1f8.m_data);
                  return (vector<float,_std::allocator<float>_> *)this;
                }
                pcVar12 = 
                "Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
                ;
                local_198 = (undefined1  [8])local_228;
              }
              else {
                pcVar12 = 
                "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>>, Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, Option = 1]"
                ;
              }
            }
            else {
              pcVar12 = 
              "Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, Option = 1]"
              ;
            }
            goto LAB_0010d6cc;
          }
        }
        pcVar12 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
        ;
        local_198 = (undefined1  [8])&local_a0;
LAB_0010d58f:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x115,pcVar12);
      }
    }
    pcVar12 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 1>]"
    ;
  }
LAB_0010d677:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,pcVar12);
}

Assistant:

inline std::vector<float> fit_shape_to_landmarks_linear(
    const morphablemodel::PcaModel& shape_model, Eigen::Matrix<float, 3, 4> affine_camera_matrix,
    const std::vector<Eigen::Vector2f>& landmarks, const std::vector<int>& vertex_ids,
    Eigen::VectorXf base_face = Eigen::VectorXf(), float lambda = 3.0f,
    cpp17::optional<int> num_coefficients_to_fit = cpp17::optional<int>(),
    cpp17::optional<float> detector_standard_deviation = cpp17::optional<float>(),
    cpp17::optional<float> model_standard_deviation = cpp17::optional<float>())
{
    assert(landmarks.size() == vertex_ids.size());

    using Eigen::VectorXf;
    using Eigen::MatrixXf;

    const int num_coeffs_to_fit = num_coefficients_to_fit.value_or(shape_model.get_num_principal_components());
    const int num_landmarks = static_cast<int>(landmarks.size());

    if (base_face.size() == 0)
    {
        base_face = shape_model.get_mean();
    }

    // $\hat{V} \in R^{3N\times m-1}$, subselect the rows of the eigenvector matrix $V$ associated with the $N$ feature points
    // And we insert a row of zeros after every third row, resulting in matrix $\hat{V}_h \in R^{4N\times m-1}$:
    MatrixXf V_hat_h = MatrixXf::Zero(4 * num_landmarks, num_coeffs_to_fit);
    int row_index = 0;
    for (int i = 0; i < num_landmarks; ++i)
    {
        // In the paper, I'm not sure whether they use the orthonormal basis. It seems a bit messy/inconsistent even in the paper.
        // Update PH 26.5.2014: I think the rescaled basis is fine/better!
        const auto& basis_rows = shape_model.get_rescaled_pca_basis_at_point(vertex_ids[i]);
        V_hat_h.block(row_index, 0, 3, V_hat_h.cols()) =
            basis_rows.block(0, 0, basis_rows.rows(), num_coeffs_to_fit);
        row_index += 4; // replace 3 rows and skip the 4th one, it has all zeros
    }

    // Form a block diagonal matrix $P \in R^{3N\times 4N}$ in which the camera matrix C (P_Affine, affine_camera_matrix) is placed on the diagonal:
    Eigen::SparseMatrix<float> P(3 * num_landmarks, 4 * num_landmarks);
    std::vector<Eigen::Triplet<float>> P_coefficients; // list of non-zeros coefficients
    for (int i = 0; i < num_landmarks; ++i) { // Note: could make this the inner-most loop.
        for (int x = 0; x < affine_camera_matrix.rows(); ++x) {
            for (int y = 0; y < affine_camera_matrix.cols(); ++y) {
                P_coefficients.push_back(
                    Eigen::Triplet<float>(3 * i + x, 4 * i + y, affine_camera_matrix(x, y)));
            }
        }
    }
    P.setFromTriplets(P_coefficients.begin(), P_coefficients.end());

    // The variances: Add the 2D and 3D standard deviations.
    // If the user doesn't provide them, we choose the following:
    // 2D (detector) standard deviation: In pixel, we follow [1] and choose sqrt(3) as the default value.
    // 3D (model) variance: 0.0f. It only makes sense to set it to something when we have a different variance
    // for different vertices.
    // The 3D variance has to be projected to 2D (for details, see paper [1]) so the units do match up.
    const float sigma_squared_2D = std::pow(detector_standard_deviation.value_or(std::sqrt(3.0f)), 2) +
                                   std::pow(model_standard_deviation.value_or(0.0f), 2);
    // We use a VectorXf, and later use .asDiagonal():
    const VectorXf Omega = VectorXf::Constant(3 * num_landmarks, 1.0f / sigma_squared_2D);
    // Earlier, we set Sigma in a for-loop and then computed Omega, but it was really unnecessary:
    // Sigma(i, i) = sqrt(sigma_squared_2D), but then Omega is Sigma.t() * Sigma (squares the diagonal) - so
    // we just assign 1/sigma_squared_2D to Omega here.

    // The landmarks in matrix notation (in homogeneous coordinates), $3N\times 1$
    VectorXf y = VectorXf::Ones(3 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        y(3 * i) = landmarks[i][0];
        y((3 * i) + 1) = landmarks[i][1];
        // y((3 * i) + 2) = 1; // already 1, stays (homogeneous coordinate)
    }

    // The mean, with an added homogeneous coordinate (x_1, y_1, z_1, 1, x_2, ...)^t
    VectorXf v_bar = VectorXf::Ones(4 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        v_bar(4 * i) = base_face(vertex_ids[i] * 3);
        v_bar((4 * i) + 1) = base_face(vertex_ids[i] * 3 + 1);
        v_bar((4 * i) + 2) = base_face(vertex_ids[i] * 3 + 2);
        // v_bar((4 * i) + 3) = 1; // already 1, stays (homogeneous coordinate)
    }

    // Bring into standard regularised quadratic form with diagonal distance matrix Omega:
    const MatrixXf A = P * V_hat_h; // camera matrix times the basis
    const MatrixXf b = P * v_bar - y; // camera matrix times the mean, minus the landmarks
    const MatrixXf AtOmegaAReg = A.transpose() * Omega.asDiagonal() * A +
                                 lambda * Eigen::MatrixXf::Identity(num_coeffs_to_fit, num_coeffs_to_fit);
    const MatrixXf rhs = -A.transpose() * Omega.asDiagonal() * b; // It's -A^t*Omega^t*b, but we don't need to
                                                                  // transpose Omega, since it's a diagonal
                                                                  // matrix, and Omega^t = Omega.

    // c_s: The 'x' that we solve for. (The variance-normalised shape parameter vector, $c_s =
    // [a_1/sigma_{s,1} , ..., a_m-1/sigma_{s,m-1}]^t$.)
    // We get coefficients ~ N(0, 1), because we're fitting with the rescaled basis. The coefficients are not
    // multiplied with their eigenvalues.
    const VectorXf c_s = AtOmegaAReg.colPivHouseholderQr().solve(rhs);

    return std::vector<float>(c_s.data(), c_s.data() + c_s.size());
}